

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ModportPortSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((kind == ModportExplicitPort) || (kind == ModportNamedPort)) ||
     (kind == ModportSubroutinePort)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ModportPortSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ModportExplicitPort:
        case SyntaxKind::ModportNamedPort:
        case SyntaxKind::ModportSubroutinePort:
            return true;
        default:
            return false;
    }
}